

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O2

bool __thiscall
gl4cts::SparseTexture2CommitmentTestCase::writeDataToTexture
          (SparseTexture2CommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  GLint GVar1;
  uint target_00;
  Functions *pFVar2;
  pointer pixels;
  int iVar3;
  GLenum GVar4;
  ostream *poVar5;
  TestError *this_00;
  undefined4 in_register_0000000c;
  int iVar6;
  SparseTexture2CommitmentTestCase *this_01;
  size_type __new_size;
  GLint depth;
  uint local_3c8;
  GLint local_3c4;
  GLint height;
  GLint width;
  undefined8 local_3b8;
  SparseTexture2CommitmentTestCase *local_3b0;
  TransferFormat local_3a8;
  GLuint *local_3a0;
  ostream *local_398;
  Functions *local_390;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecData;
  string shader;
  string local_350;
  string local_330;
  ShaderProgram program;
  TokenStrings s;
  ProgramSources sources;
  
  local_3b8 = CONCAT44(in_register_0000000c,format);
  local_398 = (ostream *)&(this->super_SparseTextureCommitmentTestCase).field_0x88;
  local_3a0 = texture;
  poVar5 = std::operator<<(local_398,"Fill Texture [level: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,level);
  std::operator<<(poVar5,"] - ");
  if (level <= (this->super_SparseTextureCommitmentTestCase).mState.levels + -1) {
    local_3a8 = glu::getTransferFormat((this->super_SparseTextureCommitmentTestCase).mState.format);
    local_3c8 = target;
    local_3c4 = level;
    local_3b0 = this;
    SparseTextureUtils::getTextureLevelSize
              (target,&(this->super_SparseTextureCommitmentTestCase).mState,level,&width,&height,
               &depth);
    target_00 = local_3c8;
    if ((0 < height && 0 < width) &&
       ((local_3b0->super_SparseTextureCommitmentTestCase).mState.minDepth <= depth)) {
      if (local_3c8 == 0x8513) {
        depth = depth * 6;
      }
      GVar1 = depth;
      iVar6 = height * width;
      iVar3 = tcu::TextureFormat::getPixelSize
                        (&(local_3b0->super_SparseTextureCommitmentTestCase).mState.format);
      vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __new_size = (size_type)(iVar3 * GVar1 * iVar6);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecData,__new_size);
      pixels = vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memset(vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0xff,__new_size);
      if ((target_00 & 0xfffffffd) == 0x9100) {
        local_390 = gl;
        for (iVar3 = 0; iVar3 < (local_3b0->super_SparseTextureCommitmentTestCase).mState.samples;
            iVar3 = iVar3 + 1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&shader,st2_compute_textureFill,(allocator<char> *)&s);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_350,"image",(allocator<char> *)&sources);
          this_01 = (SparseTexture2CommitmentTestCase *)0x17f30d4;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_330,"image",(allocator<char> *)&program);
          createShaderTokens(&s,this_01,local_3c8,(GLint)local_3b8,iVar3,&local_350,&local_330);
          std::__cxx11::string::~string((string *)&local_330);
          std::__cxx11::string::~string((string *)&local_350);
          replaceToken("<INPUT_TYPE>",s.inputType._M_dataplus._M_p,&shader);
          replaceToken("<POINT_TYPE>",s.pointType._M_dataplus._M_p,&shader);
          replaceToken("<POINT_DEF>",s.pointDef._M_dataplus._M_p,&shader);
          replaceToken("<RETURN_TYPE>",s.returnType._M_dataplus._M_p,&shader);
          replaceToken("<RESULT_EXPECTED>",s.resultExpected._M_dataplus._M_p,&shader);
          replaceToken("<SAMPLE_DEF>",s.sampleDef._M_dataplus._M_p,&shader);
          memset(&sources,0,0xac);
          sources.transformFeedbackVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          sources.transformFeedbackVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          sources.transformFeedbackVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          sources.transformFeedbackVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          sources._193_8_ = 0;
          glu::ComputeSource::ComputeSource((ComputeSource *)&program,&shader);
          glu::ProgramSources::operator<<(&sources,(ShaderSource *)&program);
          pFVar2 = local_390;
          std::__cxx11::string::~string
                    ((string *)
                     &program.m_shaders[0].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_finish);
          glu::ShaderProgram::ShaderProgram
                    (&program,((local_3b0->super_SparseTextureCommitmentTestCase).super_TestCase.
                              m_context)->m_renderCtx,&sources);
          if (program.m_program.m_info.linkOk == true) {
            (*pFVar2->useProgram)(program.m_program.m_program);
            GVar4 = (*pFVar2->getError)();
            glu::checkError(GVar4,"glUseProgram",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x419);
            (*pFVar2->bindImageTexture)(0,*local_3a0,local_3c4,'\0',0,0x88b9,(GLenum)local_3b8);
            GVar4 = (*pFVar2->getError)();
            glu::checkError(GVar4,"glBindImageTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x41c);
            (*pFVar2->uniform1i)(1,0);
            GVar4 = (*pFVar2->getError)();
            glu::checkError(GVar4,"glUniform1i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x41e);
            (*pFVar2->dispatchCompute)(width,height,depth);
            GVar4 = (*pFVar2->getError)();
            glu::checkError(GVar4,"glDispatchCompute",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x420);
            (*pFVar2->memoryBarrier)(0xffffffff);
            GVar4 = (*pFVar2->getError)();
            glu::checkError(GVar4,"glMemoryBarrier",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x422);
          }
          else {
            poVar5 = std::operator<<(local_398,
                                     "Compute shader compilation failed (writing) for target: ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_3c8);
            poVar5 = std::operator<<(poVar5,", format: ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)local_3b8);
            poVar5 = std::operator<<(poVar5,", sample: ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
            poVar5 = std::operator<<(poVar5,", infoLog: ");
            poVar5 = std::operator<<(poVar5,(string *)
                                            &((*program.m_shaders[5].
                                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                             infoLog);
            poVar5 = std::operator<<(poVar5,", shaderSource: ");
            poVar5 = std::operator<<(poVar5,shader._M_dataplus._M_p);
            std::operator<<(poVar5," - ");
          }
          glu::ShaderProgram::~ShaderProgram(&program);
          glu::ProgramSources::~ProgramSources(&sources);
          TokenStrings::~TokenStrings(&s);
          std::__cxx11::string::~string((string *)&shader);
        }
      }
      else {
        gl4cts::Texture::SubImage
                  (gl,target_00,local_3c4,0,0,0,width,height,depth,local_3a8.format,
                   local_3a8.dataType,pixels);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"SubImage",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x3fe);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    return true;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid level",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
             ,0x3e4);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool SparseTexture2CommitmentTestCase::writeDataToTexture(const Functions& gl, GLint target, GLint format,
														  GLuint& texture, GLint level)
{
	mLog << "Fill Texture [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	TransferFormat transferFormat = glu::getTransferFormat(mState.format);

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (width > 0 && height > 0 && depth >= mState.minDepth)
	{
		if (target == GL_TEXTURE_CUBE_MAP)
			depth = depth * 6;

		GLint texSize = width * height * depth * mState.format.getPixelSize();

		std::vector<GLubyte> vecData;
		vecData.resize(texSize);
		GLubyte* data = vecData.data();

		deMemset(data, 255, texSize);

		if (target != GL_TEXTURE_2D_MULTISAMPLE && target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
		{
			Texture::SubImage(gl, target, level, 0, 0, 0, width, height, depth, transferFormat.format,
							  transferFormat.dataType, (GLvoid*)data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "SubImage");
		}
		// For multisample texture use compute shader to store image data
		else
		{
			for (GLint sample = 0; sample < mState.samples; ++sample)
			{
				std::string shader = st2_compute_textureFill;

				// Adjust shader source to texture format
				TokenStrings s = createShaderTokens(target, format, sample);

				replaceToken("<INPUT_TYPE>", s.inputType.c_str(), shader);
				replaceToken("<POINT_TYPE>", s.pointType.c_str(), shader);
				replaceToken("<POINT_DEF>", s.pointDef.c_str(), shader);
				replaceToken("<RETURN_TYPE>", s.returnType.c_str(), shader);
				replaceToken("<RESULT_EXPECTED>", s.resultExpected.c_str(), shader);
				replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), shader);

				ProgramSources sources;
				sources << ComputeSource(shader);

				// Build and run shader
				ShaderProgram program(m_context.getRenderContext(), sources);
				if (program.isOk())
				{
					gl.useProgram(program.getProgram());
					GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");
					gl.bindImageTexture(0 /* unit */, texture, level /* level */, GL_FALSE /* layered */, 0 /* layer */,
										GL_WRITE_ONLY, format);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
					gl.uniform1i(1, 0 /* image_unit */);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
					gl.dispatchCompute(width, height, depth);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute");
					gl.memoryBarrier(GL_ALL_BARRIER_BITS);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier");
				}
				else
				{
					mLog << "Compute shader compilation failed (writing) for target: " << target
						 << ", format: " << format << ", sample: " << sample
						 << ", infoLog: " << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog
						 << ", shaderSource: " << shader.c_str() << " - ";
				}
			}
		}
	}

	return true;
}